

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

void __thiscall ast::Identifier::~Identifier(Identifier *this)

{
  operator_delete(this);
  return;
}

Assistant:

Identifier(string name, Location location) :
		Expression {location} {
		if (name.compare(0, 5, "line#") == 0)	{ //	Simbolo .	 (ponto)
			symbol = new Symbol(location, name, Value_type::LABEL, Sections::current_section->number,
						 new Value(Sections::current_section->content_size, location));
			Symbols::add(symbol);
		}
		else {
			symbol = Symbols::search(name);
			if (symbol == nullptr)
				symbol = new Symbol(location, name, Value_type::UNDEFINED, 0, nullptr);
			Symbols::add(symbol);
		}
	}